

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_cookie.c
# Opt level: O0

ares_bool_t timeval_expired(ares_timeval_t *tv,ares_timeval_t *now,unsigned_long millsecs)

{
  undefined1 local_40 [8];
  ares_timeval_t tvdiff;
  ares_int64_t tvdiff_ms;
  unsigned_long millsecs_local;
  ares_timeval_t *now_local;
  ares_timeval_t *tv_local;
  
  ares_timeval_diff((ares_timeval_t *)local_40,tv,now);
  tv_local._4_4_ =
       (ares_bool_t)
       ((long)millsecs <= (long)((long)local_40 * 1000 + (ulong)(uint)tvdiff.sec / 1000));
  return tv_local._4_4_;
}

Assistant:

static ares_bool_t timeval_expired(const ares_timeval_t *tv,
                                   const ares_timeval_t *now,
                                   unsigned long         millsecs)
{
  ares_int64_t   tvdiff_ms;
  ares_timeval_t tvdiff;
  ares_timeval_diff(&tvdiff, tv, now);

  tvdiff_ms = tvdiff.sec * 1000 + tvdiff.usec / 1000;
  if (tvdiff_ms >= (ares_int64_t)millsecs) {
    return ARES_TRUE;
  }
  return ARES_FALSE;
}